

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O3

void __thiscall
nuraft::buffer_serializer::put_bytes(buffer_serializer *this,void *raw_ptr,size_t len)

{
  size_t sVar1;
  size_t sVar2;
  overflow_error *this_00;
  
  sVar1 = this->pos_;
  sVar2 = buffer::size(this->buf_);
  if (len + sVar1 + 4 <= sVar2) {
    put_u32(this,(uint32_t)len);
    put_raw(this,raw_ptr,len);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer_serializer::put_bytes(const void* raw_ptr, size_t len) {
    if ( !is_valid(len + sizeof(uint32_t)) ) {
        throw std::overflow_error("not enough space");
    }
    put_u32(len);
    put_raw(raw_ptr, len);
}